

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O3

QString * __thiscall
QtMWidgets::Section::value(QString *__return_storage_ptr__,Section *this,QDateTime *dt)

{
  Type TVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  QByteArrayView QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QByteArrayView QVar19;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QString local_48;
  undefined8 local_30;
  undefined4 local_24;
  
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  TVar1 = this->type;
  iVar6 = (int)&local_68;
  if ((int)TVar1 < 0x80) {
    if ((int)TVar1 < 0x10) {
      switch(TVar1) {
      case AmPmSection:
        uVar9 = QDateTime::time();
        local_68 = (QArrayData *)CONCAT44(local_68._4_4_,uVar9);
        iVar6 = QTime::hour();
        if (iVar6 < 0xd) {
LAB_00178c65:
          local_24 = QDateTime::time();
          iVar6 = QTime::hour();
          if (iVar6 == 0) goto LAB_00179091;
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          QVar10.m_data = (storage_type *)0x2;
          QVar10.m_size = (qsizetype)&local_68;
          QString::fromLatin1(QVar10);
        }
        else {
          uVar9 = QDateTime::time();
          local_30 = CONCAT44(local_30._4_4_,uVar9);
          iVar6 = QTime::hour();
          if (0x17 < iVar6) goto LAB_00178c65;
LAB_00179091:
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          QVar19.m_data = (storage_type *)0x2;
          QVar19.m_size = (qsizetype)&local_68;
          QString::fromLatin1(QVar19);
        }
        pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        pcVar3 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_68;
        (__return_storage_ptr__->d).ptr = pcStack_60;
        qVar4 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_58;
        local_68 = pQVar2;
        pcStack_60 = pcVar3;
        local_58 = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,8);
          }
        }
        goto LAB_00179060;
      case SecondSection:
        uVar9 = QDateTime::time();
        local_30 = CONCAT44(local_30._4_4_,uVar9);
        uVar7 = QTime::second();
        if ((uVar7 < 10) && (this->zeroesAdded != false)) {
          QVar15.m_data = (char *)0x1;
          QVar15.m_size = (qsizetype)&local_48;
          QString::append(QVar15);
        }
        QString::number(iVar6,uVar7);
        QString::append(&local_48);
        break;
      default:
switchD_00178c2f_caseD_3:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_00179060;
      case MinuteSection:
        uVar9 = QDateTime::time();
        local_30 = CONCAT44(local_30._4_4_,uVar9);
        uVar7 = QTime::minute();
        if ((uVar7 < 10) && (this->zeroesAdded != false)) {
          QVar14.m_data = (char *)0x1;
          QVar14.m_size = (qsizetype)&local_48;
          QString::append(QVar14);
        }
        QString::number(iVar6,uVar7);
        QString::append(&local_48);
        break;
      case Hour12Section:
        uVar9 = QDateTime::time();
        local_68 = (QArrayData *)CONCAT44(local_68._4_4_,uVar9);
        uVar8 = QTime::hour();
        uVar7 = 0xc;
        if (uVar8 != 0) {
          uVar7 = uVar8;
        }
        if (0xc < (int)uVar8) {
          uVar7 = uVar8 - 0xc;
        }
        if ((uVar7 < 10) && (this->zeroesAdded != false)) {
          QVar13.m_data = (char *)0x1;
          QVar13.m_size = (qsizetype)&local_48;
          QString::append(QVar13);
        }
        QString::number(iVar6,uVar7);
        QString::append(&local_48);
      }
    }
    else {
      if (TVar1 != Hour24Section) {
        if ((TVar1 == DaySection) || (TVar1 == DaySectionShort)) goto LAB_00178ce6;
        goto switchD_00178c2f_caseD_3;
      }
      uVar9 = QDateTime::time();
      local_30 = CONCAT44(local_30._4_4_,uVar9);
      uVar7 = QTime::hour();
      if ((uVar7 < 10) && (this->zeroesAdded != false)) {
        QVar16.m_data = (char *)0x1;
        QVar16.m_size = (qsizetype)&local_48;
        QString::append(QVar16);
      }
      QString::number(iVar6,uVar7);
      QString::append(&local_48);
    }
  }
  else {
    if (0x3ff < (int)TVar1) {
      if (TVar1 != MonthSectionLong) {
        if (TVar1 == YearSection) {
          local_30 = QDateTime::date();
          uVar7 = QDate::year();
          if ((uVar7 < 10) && (this->zeroesAdded != false)) {
            QVar18.m_data = (char *)0x1;
            QVar18.m_size = (qsizetype)&local_48;
            QString::append(QVar18);
          }
          QString::number(iVar6,uVar7);
          QString::append(&local_48);
          goto LAB_0017901d;
        }
        if (TVar1 == YearSection2Digits) {
          local_30 = QDateTime::date();
          uVar7 = QDate::year();
          if ((uVar7 < 10) && (this->zeroesAdded != false)) {
            QVar12.m_data = (char *)0x1;
            QVar12.m_size = (qsizetype)&local_48;
            QString::append(QVar12);
          }
          QString::number(iVar6,uVar7);
          QString::append(&local_48);
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_68,2,8);
            }
          }
          QString::right((longlong)__return_storage_ptr__);
          goto LAB_00179060;
        }
      }
      goto switchD_00178c2f_caseD_3;
    }
    if (TVar1 == DaySectionLong) {
LAB_00178ce6:
      local_30 = QDateTime::date();
      uVar7 = QDate::day();
      if ((uVar7 < 10) && (this->zeroesAdded != false)) {
        QVar11.m_data = (char *)0x1;
        QVar11.m_size = (qsizetype)&local_48;
        QString::append(QVar11);
      }
      QString::number(iVar6,uVar7);
      QString::append(&local_48);
    }
    else {
      if (TVar1 != MonthSection) goto switchD_00178c2f_caseD_3;
      local_30 = QDateTime::date();
      uVar7 = QDate::month();
      if ((uVar7 < 10) && (this->zeroesAdded != false)) {
        QVar17.m_data = (char *)0x1;
        QVar17.m_size = (qsizetype)&local_48;
        QString::append(QVar17);
      }
      QString::number(iVar6,uVar7);
      QString::append(&local_48);
    }
  }
LAB_0017901d:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  pDVar5 = local_48.d.d;
  local_48.d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar5;
  (__return_storage_ptr__->d).ptr = local_48.d.ptr;
  local_48.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = local_48.d.size;
  local_48.d.size = 0;
LAB_00179060:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString
Section::value( const QDateTime & dt ) const
{
	QString v;

	switch( type )
	{
		case AmPmSection :
			if( ( dt.time().hour() > 12 && dt.time().hour() <= 23 ) ||
				dt.time().hour() == 0 )
					return QLatin1String( "PM" );
			else
				return QLatin1String( "AM" );
		break;

		case SecondSection :
		{
			makeSectionValue( v, dt.time().second(), zeroesAdded );
			return v;
		}
		break;

		case MinuteSection :
		{
			makeSectionValue( v, dt.time().minute(), zeroesAdded );
			return v;
		}
		break;

		case Hour12Section :
		{
			int hour = dt.time().hour();

			if( hour > 12 )
				hour -= 12;
			else if( hour == 0 )
				hour = 12;

			makeSectionValue( v, hour, zeroesAdded );

			return v;
		}
		break;

		case Hour24Section :
		{
			makeSectionValue( v, dt.time().hour(), zeroesAdded );
			return v;
		}
		break;

		case DaySection :
		case DaySectionShort :
		case DaySectionLong :
		{
			makeSectionValue( v, dt.date().day(), zeroesAdded );
			return v;
		}
		break;

		case MonthSection :
		{
			makeSectionValue( v, dt.date().month(), zeroesAdded );
			return v;
		}
		break;

		case MonthSectionShort :
		case MonthSectionLong :
			return v;
		break;

		case YearSection :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v;
		}
		break;

		case YearSection2Digits :
		{
			makeSectionValue( v, dt.date().year(), zeroesAdded );
			return v.right( 2 );
		}
		break;

		default :
			return v;
		break;
	}

	return v;
}